

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowser::clearHistory(QTextBrowser *this)

{
  bool bVar1;
  QTextBrowserPrivate *pQVar2;
  long in_FS_OFFSET;
  QTextBrowserPrivate *d;
  HistoryEntry historyEntry;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTextBrowser *)0x6df64a);
  QList<QTextBrowserPrivate::HistoryEntry>::clear
            ((QList<QTextBrowserPrivate::HistoryEntry> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  bVar1 = QList<QTextBrowserPrivate::HistoryEntry>::isEmpty
                    ((QList<QTextBrowserPrivate::HistoryEntry> *)0x6df671);
  if (!bVar1) {
    memset(local_40,0xaa,0x38);
    QStack<QTextBrowserPrivate::HistoryEntry>::top
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6df69a);
    QTextBrowserPrivate::HistoryEntry::HistoryEntry
              ((HistoryEntry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (HistoryEntry *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    QList<QTextBrowserPrivate::HistoryEntry>::clear
              ((QList<QTextBrowserPrivate::HistoryEntry> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    QStack<QTextBrowserPrivate::HistoryEntry>::push
              ((QStack<QTextBrowserPrivate::HistoryEntry> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (HistoryEntry *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    QUrl::operator=(&pQVar2->home,(QUrl *)local_40);
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry
              ((HistoryEntry *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  forwardAvailable((QTextBrowser *)0x6df6fe,(bool)in_stack_ffffffffffffff9f);
  backwardAvailable((QTextBrowser *)0x6df70c,(bool)in_stack_ffffffffffffff9f);
  historyChanged((QTextBrowser *)0x6df716);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::clearHistory()
{
    Q_D(QTextBrowser);
    d->forwardStack.clear();
    if (!d->stack.isEmpty()) {
        QTextBrowserPrivate::HistoryEntry historyEntry = d->stack.top();
        d->stack.clear();
        d->stack.push(historyEntry);
        d->home = historyEntry.url;
    }
    emit forwardAvailable(false);
    emit backwardAvailable(false);
    emit historyChanged();
}